

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.cc
# Opt level: O0

void __thiscall google::protobuf::io::Printer::WriteRaw(Printer *this,char *data,size_t size)

{
  bool bVar1;
  reference pvVar2;
  char local_51;
  ulong uStack_50;
  char c;
  size_t i;
  pair<unsigned_long,_unsigned_long> *pair;
  string *var;
  iterator __end3;
  iterator __begin3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range3;
  size_t size_local;
  char *data_local;
  Printer *this_local;
  
  if (((this->failed_ & 1U) == 0) && (size != 0)) {
    if (((this->at_start_of_line_ & 1U) != 0) && (*data != '\n')) {
      IndentIfAtStart(this);
      if ((this->failed_ & 1U) != 0) {
        return;
      }
      __end3 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin(&this->line_start_variables_);
      var = (string *)
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::end(&this->line_start_variables_);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end3,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                         *)&var), bVar1) {
        pair = (pair<unsigned_long,_unsigned_long> *)
               __gnu_cxx::
               __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&__end3);
        i = (size_t)absl::lts_20250127::container_internal::
                    raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,std::pair<unsigned_long,unsigned_long>>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,std::pair<unsigned_long,unsigned_long>>>>
                    ::
                    operator[]<std::__cxx11::string,absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,std::pair<unsigned_long,unsigned_long>>>
                              ((raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,std::pair<unsigned_long,unsigned_long>>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,std::pair<unsigned_long,unsigned_long>>>>
                                *)&this->substitutions_,
                               (key_arg<std::__cxx11::basic_string<char>_> *)pair);
        ((MappedReference<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char>,_std::pair<unsigned_long,_unsigned_long>_>_>
          )i)->first = this->indent_ +
                       ((MappedReference<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char>,_std::pair<unsigned_long,_unsigned_long>_>_>
                         )i)->first;
        ((MappedReference<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char>,_std::pair<unsigned_long,_unsigned_long>_>_>
          )i)->second =
             this->indent_ +
             ((MappedReference<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char>,_std::pair<unsigned_long,_unsigned_long>_>_>
               )i)->second;
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&__end3);
      }
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::clear(&this->line_start_variables_);
    bVar1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::empty
                      (&this->paren_depth_to_omit_);
    if (bVar1) {
      zc_sink_internal::ZeroCopyStreamByteSink::Append(&this->sink_,data,size);
    }
    else {
      for (uStack_50 = 0; uStack_50 < size; uStack_50 = uStack_50 + 1) {
        local_51 = data[uStack_50];
        if (local_51 == '(') {
          this->paren_depth_ = this->paren_depth_ + 1;
          bVar1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::empty
                            (&this->paren_depth_to_omit_);
          if ((bVar1) ||
             (pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::back
                                 (&this->paren_depth_to_omit_), *pvVar2 != this->paren_depth_)) {
            zc_sink_internal::ZeroCopyStreamByteSink::Append(&this->sink_,&local_51,1);
          }
        }
        else if (local_51 == ')') {
          bVar1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::empty
                            (&this->paren_depth_to_omit_);
          if ((bVar1) ||
             (pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::back
                                 (&this->paren_depth_to_omit_), *pvVar2 != this->paren_depth_)) {
            this->paren_depth_ = this->paren_depth_ - 1;
            zc_sink_internal::ZeroCopyStreamByteSink::Append(&this->sink_,&local_51,1);
          }
          else {
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::pop_back
                      (&this->paren_depth_to_omit_);
            this->paren_depth_ = this->paren_depth_ - 1;
          }
        }
        else {
          zc_sink_internal::ZeroCopyStreamByteSink::Append(&this->sink_,&local_51,1);
        }
      }
    }
    bVar1 = zc_sink_internal::ZeroCopyStreamByteSink::failed(&this->sink_);
    this->failed_ = (this->failed_ & 1U) != 0 || bVar1;
  }
  return;
}

Assistant:

void Printer::WriteRaw(const char* data, size_t size) {
  if (failed_ || size == 0) {
    return;
  }

  if (at_start_of_line_ && data[0] != '\n') {
    IndentIfAtStart();
    if (failed_) {
      return;
    }

    // Fix up empty variables (e.g., "{") that should be annotated as
    // coming after the indent.
    for (const std::string& var : line_start_variables_) {
      auto& pair = substitutions_[var];
      pair.first += indent_;
      pair.second += indent_;
    }
  }

  // If we're going to write any data, clear line_start_variables_, since
  // we've either updated them in the block above or they no longer refer to
  // the current line.
  line_start_variables_.clear();

  if (paren_depth_to_omit_.empty()) {
    sink_.Append(data, size);
  } else {
    for (size_t i = 0; i < size; ++i) {
      char c = data[i];
      switch (c) {
        case '(':
          paren_depth_++;
          if (!paren_depth_to_omit_.empty() &&
              paren_depth_to_omit_.back() == paren_depth_) {
            break;
          }

          sink_.Append(&c, 1);
          break;
        case ')':
          if (!paren_depth_to_omit_.empty() &&
              paren_depth_to_omit_.back() == paren_depth_) {
            paren_depth_to_omit_.pop_back();
            paren_depth_--;
            break;
          }

          paren_depth_--;
          sink_.Append(&c, 1);
          break;
        default:
          sink_.Append(&c, 1);
          break;
      }
    }
  }
  failed_ |= sink_.failed();
}